

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::selection_statement(Parser *this)

{
  Node *pNVar1;
  bool bVar2;
  Node *this_00;
  Node *pNVar3;
  allocator local_b1;
  string local_b0 [40];
  Node *else_node;
  Node *compound_else_node;
  allocator local_69;
  string local_68 [32];
  Node *local_48;
  Node *selection_node;
  Node *compound_node;
  Node *local_18;
  Node *expression_node;
  Parser *this_local;
  
  expression_node = (Node *)this;
  Lexer::next_token(this->lex);
  local_18 = expression(this);
  eat_abi_cxx11_((Parser *)&compound_node,(token_type)this);
  std::__cxx11::string::~string((string *)&compound_node);
  selection_node = compound_statement(this);
  this_00 = (Node *)operator_new(0x48);
  pNVar3 = local_18;
  pNVar1 = selection_node;
  compound_else_node._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  Node::Node(this_00,IF,pNVar3,pNVar1,(string *)local_68,(Node *)0x0,(Node *)0x0);
  compound_else_node._3_1_ = 0;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = this_00;
  bVar2 = tryEat(this,ELSE);
  if (bVar2) {
    Lexer::next_token(this->lex);
    else_node = compound_statement(this);
    pNVar3 = (Node *)operator_new(0x48);
    pNVar1 = else_node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",&local_b1);
    Node::Node(pNVar3,ELSE,pNVar1,(Node *)0x0,(string *)local_b0,(Node *)0x0,(Node *)0x0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    local_48->operand3 = pNVar3;
  }
  return local_48;
}

Assistant:

Node* Parser::selection_statement()
{
	lex->next_token();

	Node* expression_node = expression();

	eat(token_type::LBRACE);
	Node* compound_node = compound_statement();

	Node* selection_node = new Node(node_type::IF, expression_node, compound_node);

	if (tryEat(token_type::ELSE)) {
		lex->next_token();

		Node* compound_else_node = compound_statement();
		Node* else_node = new Node(node_type::ELSE, compound_else_node);
		selection_node->operand3 = else_node;
	}

	return selection_node;
}